

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
Qentem::Array<Qentem::Tags::TagBit>::resize(Array<Qentem::Tags::TagBit> *this,SizeT new_size)

{
  TagBit *from;
  TagBit *to;
  
  from = this->storage_;
  this->capacity_ = new_size;
  to = allocate(this);
  Memory::Copy<unsigned_int>(to,from,this->index_ << 4);
  if (from != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(from);
  }
  operator_delete(from);
  return;
}

Assistant:

void resize(SizeT new_size) {
        constexpr SizeT32 type_size = sizeof(Type_T);
        Type_T           *src       = Storage();

        setCapacity(new_size);

        Type_T *des = allocate();
        Memory::Copy(des, src, (Size() * type_size));
        Memory::Deallocate(src);
    }